

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  short sVar1;
  short sVar2;
  WherePath *pWVar3;
  WhereLoop *pWVar4;
  i8 iVar5;
  LogEst LVar6;
  i8 local_f0;
  int local_e8;
  Bitmask BStack_e0;
  int nOrder;
  Bitmask revMask_1;
  Bitmask BStack_d0;
  int rc_1;
  Bitmask m;
  u32 wsFlags;
  int rc;
  Bitmask notUsed;
  WhereLevel *pLevel;
  Bitmask revMask;
  Bitmask maskNew;
  short local_98;
  short local_96;
  i8 isOrdered;
  int iStack_94;
  LogEst rUnsorted;
  LogEst rCost;
  LogEst nOut;
  int nSpace;
  char *pSpace;
  LogEst *aSortCost;
  WhereLoop **pX;
  WhereLoop *pWLoop;
  WherePath *pTo;
  WherePath *pFrom;
  WherePath *aTo;
  WherePath *aFrom;
  int nFrom;
  int nTo;
  LogEst mxUnsorted;
  LogEst mxCost;
  int nOrderBy;
  int mxI;
  int jj;
  int ii;
  int iLoop;
  Parse *pParse;
  int local_20;
  int nLoop;
  int mxChoice;
  LogEst nRowEst_local;
  WhereInfo *pWInfo_local;
  
  _mxUnsorted = 0;
  nFrom._2_2_ = 0;
  nFrom._0_2_ = 0;
  pSpace = (char *)0x0;
  _ii = pWInfo->pParse;
  pParse._4_4_ = (uint)pWInfo->nLevel;
  if (pParse._4_4_ < 2) {
    local_e8 = 1;
  }
  else {
    local_e8 = 10;
    if (pParse._4_4_ == 2) {
      local_e8 = 5;
    }
  }
  local_20 = local_e8;
  if ((pWInfo->pOrderBy == (ExprList *)0x0) || (nRowEst == 0)) {
    nTo = 0;
  }
  else {
    nTo = pWInfo->pOrderBy->nExpr;
  }
  iStack_94 = (pParse._4_4_ * 8 + 0x20) * local_e8 * 2 + nTo * 2;
  nLoop._2_2_ = nRowEst;
  _mxChoice = pWInfo;
  _rCost = (WherePath *)sqlite3DbMallocRawNN(_ii->db,(long)iStack_94);
  if (_rCost == (WherePath *)0x0) {
    pWInfo_local._4_4_ = 7;
  }
  else {
    aTo = _rCost + local_20;
    pFrom = _rCost;
    memset(aTo,0,0x20);
    aSortCost = (LogEst *)(aTo + local_20);
    pTo = pFrom;
    for (mxI = local_20 << 1; 0 < mxI; mxI = mxI + -1) {
      pTo->aLoop = (WhereLoop **)aSortCost;
      pTo = pTo + 1;
      aSortCost = aSortCost + (long)(int)pParse._4_4_ * 4;
    }
    if (nTo != 0) {
      pSpace = (char *)aSortCost;
      memset(aSortCost,0,(long)nTo << 1);
    }
    if (_ii->nQueryLoop < 0x30) {
      LVar6 = _ii->nQueryLoop;
    }
    else {
      LVar6 = 0x30;
    }
    aTo->nRow = LVar6;
    aFrom._0_4_ = 1;
    if (nTo != 0) {
      if ((int)pParse._4_4_ < 1) {
        local_f0 = (i8)nTo;
      }
      else {
        local_f0 = -1;
      }
      aTo->isOrdered = local_f0;
    }
    for (jj = 0; jj < (int)pParse._4_4_; jj = jj + 1) {
      aFrom._4_4_ = 0;
      pTo = aTo;
      for (mxI = 0; mxI < (int)aFrom; mxI = mxI + 1) {
        for (pX = (WhereLoop **)_mxChoice->pLoops; pX != (WhereLoop **)0x0; pX = (WhereLoop **)pX[9]
            ) {
          if (((((ulong)*pX & (pTo->maskLoop ^ 0xffffffffffffffff)) == 0) &&
              (((ulong)pX[1] & pTo->maskLoop) == 0)) &&
             ((((ulong)pX[6] & 0x4000) == 0 || (2 < pTo->nRow)))) {
            maskNew._6_2_ =
                 sqlite3LogEstAdd(*(LogEst *)((long)pX + 0x12),
                                  *(short *)((long)pX + 0x14) + pTo->nRow);
            maskNew._6_2_ = sqlite3LogEstAdd(maskNew._6_2_,pTo->rUnsorted);
            local_96 = pTo->nRow + *(short *)((long)pX + 0x16);
            revMask = pTo->maskLoop | (ulong)pX[1];
            maskNew._5_1_ = pTo->isOrdered;
            if ((char)maskNew._5_1_ < '\0') {
              pLevel = (WhereLevel *)0x0;
              maskNew._5_1_ =
                   wherePathSatisfiesOrderBy
                             (_mxChoice,_mxChoice->pOrderBy,pTo,_mxChoice->wctrlFlags,(u16)jj,
                              (WhereLoop *)pX,(Bitmask *)&pLevel);
            }
            else {
              pLevel = (WhereLevel *)pTo->revLoop;
            }
            if (((char)maskNew._5_1_ < '\0') || (nTo <= (char)maskNew._5_1_)) {
              local_98 = maskNew._6_2_;
              maskNew._6_2_ = maskNew._6_2_ + -2;
            }
            else {
              if (*(short *)(pSpace + (long)(char)maskNew._5_1_ * 2) == 0) {
                LVar6 = whereSortingCost(_mxChoice,nLoop._2_2_,nTo,(int)(char)maskNew._5_1_);
                *(LogEst *)(pSpace + (long)(char)maskNew._5_1_ * 2) = LVar6;
              }
              LVar6 = sqlite3LogEstAdd(maskNew._6_2_,
                                       *(LogEst *)(pSpace + (long)(char)maskNew._5_1_ * 2));
              local_98 = LVar6 + 3;
            }
            nOrderBy = 0;
            pWLoop = (WhereLoop *)pFrom;
            while ((nOrderBy < aFrom._4_4_ &&
                   ((pWLoop->prereq != revMask ||
                    (((int)(char)((byte)pWLoop->nOut ^ maskNew._5_1_) & 0x80U) != 0))))) {
              nOrderBy = nOrderBy + 1;
              pWLoop = (WhereLoop *)((long)&pWLoop->u + 8);
            }
            if (nOrderBy < aFrom._4_4_) {
              if ((local_98 <= pWLoop->rSetup) &&
                 ((pWLoop->rSetup != local_98 ||
                  ((sVar1._0_1_ = pWLoop->iTab, sVar1._1_1_ = pWLoop->iSortIdx, local_96 <= sVar1 &&
                   ((sVar2._0_1_ = pWLoop->iTab, sVar2._1_1_ = pWLoop->iSortIdx, sVar2 != local_96
                    || (maskNew._6_2_ < pWLoop->rRun)))))))) goto LAB_001b93f6;
            }
            else if ((aFrom._4_4_ < local_20) ||
                    ((local_98 <= nFrom._2_2_ &&
                     ((local_98 != nFrom._2_2_ || (maskNew._6_2_ < (short)(u16)nFrom)))))) {
              if (aFrom._4_4_ < local_20) {
                nOrderBy = aFrom._4_4_;
                aFrom._4_4_ = aFrom._4_4_ + 1;
              }
              else {
                nOrderBy = _mxUnsorted;
              }
              pWLoop = (WhereLoop *)(pFrom + nOrderBy);
LAB_001b93f6:
              pWLoop->prereq = pTo->maskLoop | (ulong)pX[1];
              pWLoop->maskSelf = (Bitmask)pLevel;
              pWLoop->iTab = (undefined1)local_96;
              pWLoop->iSortIdx = local_96._1_1_;
              pWLoop->rSetup = local_98;
              pWLoop->rRun = maskNew._6_2_;
              *(byte *)&pWLoop->nOut = maskNew._5_1_;
              memcpy(*(void **)&pWLoop->u,pTo->aLoop,(long)jj << 3);
              *(WhereLoop ***)(*(long *)&pWLoop->u + (long)jj * 8) = pX;
              if (local_20 <= aFrom._4_4_) {
                _mxUnsorted = 0;
                nFrom._2_2_ = pFrom->rCost;
                nFrom._0_2_ = pFrom->nRow;
                pWVar4 = (WhereLoop *)pFrom;
                for (nOrderBy = 1; pWLoop = (WhereLoop *)((long)&pWVar4->u + 8), nOrderBy < local_20
                    ; nOrderBy = nOrderBy + 1) {
                  if ((nFrom._2_2_ < *(short *)((long)&pWVar4->wsFlags + 2)) ||
                     ((*(short *)((long)&pWVar4->wsFlags + 2) == nFrom._2_2_ &&
                      ((short)(u16)nFrom < (short)pWVar4->nLTerm)))) {
                    nFrom._2_2_ = *(short *)((long)&pWVar4->wsFlags + 2);
                    nFrom._0_2_ = pWVar4->nLTerm;
                    _mxUnsorted = nOrderBy;
                  }
                  pWVar4 = pWLoop;
                }
              }
            }
          }
        }
        pTo = pTo + 1;
      }
      pTo = pFrom;
      pWVar3 = aTo;
      aTo = pFrom;
      aFrom._0_4_ = aFrom._4_4_;
      pFrom = pWVar3;
    }
    if ((int)aFrom == 0) {
      sqlite3ErrorMsg(_ii,"no query solution");
      sqlite3DbFreeNN(_ii->db,_rCost);
      pWInfo_local._4_4_ = 1;
    }
    else {
      pTo = aTo;
      for (mxI = 1; mxI < (int)aFrom; mxI = mxI + 1) {
        if (aTo[mxI].rCost < pTo->rCost) {
          pTo = aTo + mxI;
        }
      }
      for (jj = 0; jj < (int)pParse._4_4_; jj = jj + 1) {
        notUsed = (Bitmask)(_mxChoice->a + jj);
        pX = (WhereLoop **)pTo->aLoop[jj];
        ((WhereLevel *)notUsed)->pWLoop = (WhereLoop *)pX;
        ((WhereLevel *)notUsed)->iFrom = ((WhereLoop *)pX)->iTab;
        ((WhereLevel *)notUsed)->iTabCur =
             _mxChoice->pTabList->a[((WhereLevel *)notUsed)->iFrom].iCursor;
      }
      if (((((_mxChoice->wctrlFlags & 0x100) != 0) && ((_mxChoice->wctrlFlags & 0x80) == 0)) &&
          (_mxChoice->eDistinct == '\0')) && (nLoop._2_2_ != 0)) {
        iVar5 = wherePathSatisfiesOrderBy
                          (_mxChoice,_mxChoice->pResultSet,pTo,0x80,(short)pParse._4_4_ - 1,
                           pTo->aLoop[(int)(pParse._4_4_ - 1)],(Bitmask *)&wsFlags);
        m._4_4_ = (int)iVar5;
        if (m._4_4_ == _mxChoice->pResultSet->nExpr) {
          _mxChoice->eDistinct = '\x02';
        }
      }
      _mxChoice->field_0x44 = _mxChoice->field_0x44 & 0xfb;
      if (_mxChoice->pOrderBy != (ExprList *)0x0) {
        _mxChoice->nOBSat = pTo->isOrdered;
        if ((_mxChoice->wctrlFlags & 0x80) == 0) {
          _mxChoice->revMask = pTo->revLoop;
          if (_mxChoice->nOBSat < '\x01') {
            _mxChoice->nOBSat = '\0';
            if (((0 < (int)pParse._4_4_) &&
                (m._0_4_ = pTo->aLoop[(int)(pParse._4_4_ - 1)]->wsFlags, ((uint)m & 0x1000) == 0))
               && (((uint)m & 0x104) != 0x104)) {
              BStack_d0 = 0;
              iVar5 = wherePathSatisfiesOrderBy
                                (_mxChoice,_mxChoice->pOrderBy,pTo,0x800,(short)pParse._4_4_ - 1,
                                 pTo->aLoop[(int)(pParse._4_4_ - 1)],&stack0xffffffffffffff30);
              revMask_1._4_4_ = (int)iVar5;
              if (revMask_1._4_4_ == _mxChoice->pOrderBy->nExpr) {
                _mxChoice->field_0x44 = _mxChoice->field_0x44 & 0xfb | 4;
                _mxChoice->revMask = BStack_d0;
              }
            }
          }
          else if (((pParse._4_4_ != 0) && (_mxChoice->nOBSat == '\x01')) &&
                  ((_mxChoice->wctrlFlags & 3) != 0)) {
            _mxChoice->field_0x44 = _mxChoice->field_0x44 & 0xfb | 4;
          }
        }
        else if ((int)pTo->isOrdered == _mxChoice->pOrderBy->nExpr) {
          _mxChoice->eDistinct = '\x02';
        }
        if ((((_mxChoice->wctrlFlags & 0x200) != 0) &&
            ((int)_mxChoice->nOBSat == _mxChoice->pOrderBy->nExpr)) && (0 < (int)pParse._4_4_)) {
          BStack_e0 = 0;
          iVar5 = wherePathSatisfiesOrderBy
                            (_mxChoice,_mxChoice->pOrderBy,pTo,0,(short)pParse._4_4_ - 1,
                             pTo->aLoop[(int)(pParse._4_4_ - 1)],&stack0xffffffffffffff20);
          if ((int)iVar5 == _mxChoice->pOrderBy->nExpr) {
            _mxChoice->field_0x44 = _mxChoice->field_0x44 & 0xf7 | 8;
            _mxChoice->revMask = BStack_e0;
          }
        }
      }
      _mxChoice->nRowOut = pTo->nRow;
      sqlite3DbFreeNN(_ii->db,_rCost);
      pWInfo_local._4_4_ = 0;
    }
  }
  return pWInfo_local._4_4_;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted)
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}